

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void Eigen::internal::queryCacheSizes(int *l1,int *l2,int *l3)

{
  int *piVar1;
  int max_std_funcs_00;
  bool bVar2;
  int iStack_5c;
  int max_std_funcs;
  int AMDisbetter_ [3];
  int AuthenticAMD [3];
  int GenuineIntel [3];
  int abcd [4];
  int *l3_local;
  int *l2_local;
  int *l1_local;
  
  AuthenticAMD._4_8_ = 0x49656e69756e6547;
  GenuineIntel[0] = 0x6c65746e;
  AMDisbetter_._4_8_ = 0x69746e6568747541;
  AuthenticAMD[0] = 0x444d4163;
  iStack_5c._0_1_ = 'A';
  iStack_5c._1_1_ = 'M';
  iStack_5c._2_1_ = 'D';
  iStack_5c._3_1_ = 'i';
  max_std_funcs._0_1_ = 's';
  max_std_funcs._1_1_ = 'b';
  max_std_funcs._2_1_ = 'e';
  max_std_funcs._3_1_ = 't';
  AMDisbetter_[0] = 0x21726574;
  piVar1 = (int *)cpuid_basic_info(0);
  GenuineIntel[1] = *piVar1;
  max_std_funcs_00 = piVar1[1];
  GenuineIntel[2] = max_std_funcs_00;
  bVar2 = cpuid_is_vendor(GenuineIntel + 1,AuthenticAMD + 1);
  if (bVar2) {
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs_00);
  }
  else {
    bVar2 = cpuid_is_vendor(GenuineIntel + 1,AMDisbetter_ + 1);
    if ((bVar2) || (bVar2 = cpuid_is_vendor(GenuineIntel + 1,&iStack_5c), bVar2)) {
      queryCacheSizes_amd(l1,l2,l3);
    }
    else {
      queryCacheSizes_intel(l1,l2,l3,max_std_funcs_00);
    }
  }
  return;
}

Assistant:

inline void queryCacheSizes(int& l1, int& l2, int& l3)
{
  #ifdef EIGEN_CPUID
  int abcd[4];
  const int GenuineIntel[] = {0x756e6547, 0x49656e69, 0x6c65746e};
  const int AuthenticAMD[] = {0x68747541, 0x69746e65, 0x444d4163};
  const int AMDisbetter_[] = {0x69444d41, 0x74656273, 0x21726574}; // "AMDisbetter!"

  // identify the CPU vendor
  EIGEN_CPUID(abcd,0x0,0);
  int max_std_funcs = abcd[1];
  if(cpuid_is_vendor(abcd,GenuineIntel))
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  else if(cpuid_is_vendor(abcd,AuthenticAMD) || cpuid_is_vendor(abcd,AMDisbetter_))
    queryCacheSizes_amd(l1,l2,l3);
  else
    // by default let's use Intel's API
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);

  // here is the list of other vendors:
//   ||cpuid_is_vendor(abcd,"VIA VIA VIA ")
//   ||cpuid_is_vendor(abcd,"CyrixInstead")
//   ||cpuid_is_vendor(abcd,"CentaurHauls")
//   ||cpuid_is_vendor(abcd,"GenuineTMx86")
//   ||cpuid_is_vendor(abcd,"TransmetaCPU")
//   ||cpuid_is_vendor(abcd,"RiseRiseRise")
//   ||cpuid_is_vendor(abcd,"Geode by NSC")
//   ||cpuid_is_vendor(abcd,"SiS SiS SiS ")
//   ||cpuid_is_vendor(abcd,"UMC UMC UMC ")
//   ||cpuid_is_vendor(abcd,"NexGenDriven")
  #else
  l1 = l2 = l3 = -1;
  #endif
}